

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_get_total_output_satoshi(wally_tx *tx,uint64_t *value_out)

{
  _Bool _Var1;
  ulong uVar2;
  uint64_t v;
  size_t i;
  uint64_t *value_out_local;
  wally_tx *tx_local;
  
  if (value_out != (uint64_t *)0x0) {
    *value_out = 0;
  }
  _Var1 = is_valid_tx(tx);
  if ((_Var1) && (value_out != (uint64_t *)0x0)) {
    for (v = 0; v < tx->num_outputs; v = v + 1) {
      uVar2 = *value_out + tx->outputs[v].satoshi;
      if (((2100000000000000 < tx->outputs[v].satoshi) || (uVar2 < *value_out)) ||
         (2100000000000000 < uVar2)) {
        *value_out = 0;
        return -2;
      }
      *value_out = uVar2;
    }
    tx_local._4_4_ = 0;
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_get_total_output_satoshi(const struct wally_tx *tx, uint64_t *value_out)
{
    size_t i;
    if (value_out)
        *value_out = 0;

    if (!is_valid_tx(tx) || !value_out)
        return WALLY_EINVAL;

    for (i = 0; i < tx->num_outputs; ++i) {
        uint64_t v = *value_out + tx->outputs[i].satoshi;

        if (tx->outputs[i].satoshi > WALLY_SATOSHI_MAX ||
            v < *value_out || v > WALLY_SATOSHI_MAX) {
            /* Overflow or too many satoshi in outputs */
            *value_out = 0;
            return WALLY_EINVAL;
        }
        *value_out = v;
    }

    return WALLY_OK;
}